

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O3

void __thiscall
QDistanceFieldData::QDistanceFieldData(QDistanceFieldData *this,QDistanceFieldData *other)

{
  int iVar1;
  uchar *__src;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *__dest;
  
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  iVar2 = other->width;
  iVar3 = other->height;
  iVar4 = other->nbytes;
  iVar1 = other->nbytes;
  this->glyph = other->glyph;
  this->width = iVar2;
  this->height = iVar3;
  this->nbytes = iVar4;
  if ((iVar1 == 0) || (__src = other->data, __src == (uchar *)0x0)) {
    __dest = (uchar *)0x0;
  }
  else {
    __dest = (uchar *)malloc((long)iVar1);
    memcpy(__dest,__src,(long)iVar1);
  }
  this->data = __dest;
  return;
}

Assistant:

QDistanceFieldData::QDistanceFieldData(const QDistanceFieldData &other)
    : QSharedData(other)
    , glyph(other.glyph)
    , width(other.width)
    , height(other.height)
    , nbytes(other.nbytes)
{
    if (nbytes && other.data)
        data = (uchar *)memcpy(malloc(nbytes), other.data, nbytes);
    else
        data = nullptr;
}